

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

int luaL_checkoption(lua_State *L,int idx,char *def,char **lst)

{
  int iVar1;
  char *__s2;
  char *__s1;
  long lVar2;
  
  __s2 = lua_tolstring(L,idx,(size_t *)0x0);
  if ((__s2 == (char *)0x0) && (__s2 = def, def == (char *)0x0)) {
    lj_err_argt(L,idx,4);
  }
  __s1 = *lst;
  if (__s1 != (char *)0x0) {
    lVar2 = 0;
    do {
      iVar1 = strcmp(__s1,__s2);
      if (iVar1 == 0) {
        return (int)lVar2;
      }
      __s1 = lst[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (__s1 != (char *)0x0);
  }
  lj_err_argv(L,idx,LJ_ERR_INVOPTM,__s2);
}

Assistant:

LUALIB_API int luaL_checkoption(lua_State *L, int idx, const char *def,
				const char *const lst[])
{
  ptrdiff_t i;
  const char *s = lua_tolstring(L, idx, NULL);
  if (s == NULL && (s = def) == NULL)
    lj_err_argt(L, idx, LUA_TSTRING);
  for (i = 0; lst[i]; i++)
    if (strcmp(lst[i], s) == 0)
      return (int)i;
  lj_err_argv(L, idx, LJ_ERR_INVOPTM, s);
}